

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

wchar_t utf16_to_unicode(uint32_t *pwc,char *s,size_t n,wchar_t be)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *utf16;
  uint uVar4;
  int iVar5;
  uchar *p;
  
  if (n == 0) {
    return L'\0';
  }
  if (n == 1) {
    *pwc = 0xfffd;
    return L'\xffffffff';
  }
  uVar4 = (uint)(byte)s[1];
  uVar3 = (uint)(byte)*s;
  if (be == L'\0') {
    uVar4 = (uint)(byte)*s;
    uVar3 = (uint)(byte)s[1];
  }
  uVar4 = uVar3 << 8 | uVar4;
  iVar1 = (int)s;
  iVar5 = iVar1 + 2;
  if ((uVar3 & 0xfffffffc) == 0xd8) {
    if (n < 4) {
      uVar3 = 0;
    }
    else {
      uVar2 = (uint)(byte)s[3];
      uVar3 = (uint)(byte)s[2];
      if (be != L'\0') {
        uVar3 = uVar2;
        uVar2 = (uint)(byte)s[2];
      }
      uVar3 = uVar3 | uVar2 << 8;
    }
    if ((uVar3 & 0xfc00) != 0xdc00) {
      *pwc = 0xfffd;
      return L'\xfffffffe';
    }
    uVar4 = uVar4 * 0x400 + uVar3 + 0xfca02400;
    iVar5 = iVar1 + 4;
  }
  if (0x10ffff < uVar4 || (uVar4 & 0xfffff800) == 0xd800) {
    *pwc = 0xfffd;
    return iVar1 - iVar5;
  }
  *pwc = uVar4;
  return iVar5 - iVar1;
}

Assistant:

static int
utf16_to_unicode(uint32_t *pwc, const char *s, size_t n, int be)
{
	const char *utf16 = s;
	unsigned uc;

	if (n == 0)
		return (0);
	if (n == 1) {
		/* set the Replacement Character instead. */
		*pwc = UNICODE_R_CHAR;
		return (-1);
	}

	if (be)
		uc = archive_be16dec(utf16);
	else
		uc = archive_le16dec(utf16);
	utf16 += 2;
		
	/* If this is a surrogate pair, assemble the full code point.*/
	if (IS_HIGH_SURROGATE_LA(uc)) {
		unsigned uc2;

		if (n >= 4) {
			if (be)
				uc2 = archive_be16dec(utf16);
			else
				uc2 = archive_le16dec(utf16);
		} else
			uc2 = 0;
		if (IS_LOW_SURROGATE_LA(uc2)) {
			uc = combine_surrogate_pair(uc, uc2);
			utf16 += 2;
		} else {
	 		/* Undescribed code point should be U+FFFD
		 	* (replacement character). */
			*pwc = UNICODE_R_CHAR;
			return (-2);
		}
	}

	/*
	 * Surrogate pair values(0xd800 through 0xdfff) are only
	 * used by UTF-16, so, after above calculation, the code
	 * must not be surrogate values, and Unicode has no codes
	 * larger than 0x10ffff. Thus, those are not legal Unicode
	 * values.
	 */
	if (IS_SURROGATE_PAIR_LA(uc) || uc > UNICODE_MAX) {
	 	/* Undescribed code point should be U+FFFD
	 	* (replacement character). */
		*pwc = UNICODE_R_CHAR;
		return (((int)(utf16 - s)) * -1);
	}
	*pwc = uc;
	return ((int)(utf16 - s));
}